

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O3

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingFullyOpaquePixelIsCopied
          (GenericRGBXBlenderTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  color cVar3;
  color cVar4;
  color cVar5;
  color cVar6;
  FailedAssertion *pFVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint8_t local_ac;
  string local_a8;
  uint local_88;
  uint local_84;
  string local_80;
  uint local_60;
  uint local_5c;
  LocationInfo local_58;
  
  cVar3 = color::make('\x10',' ','0',0xff);
  iVar11 = (((uint)cVar3 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar3 >> 0x18) * 0x40;
  cVar4 = color::make('\x10',' ','0',0xff);
  cVar5 = color::make('\x10',' ','0',0xff);
  cVar6 = color::make('\x10',' ','0',0xff);
  local_5c = (uint)cVar3 >> 8;
  uVar8 = (uint)cVar3 >> 0x10;
  if (iVar11 != 0x4040) {
    iVar11 = iVar11 * 0xff;
    cVar3 = (color)(((uint)cVar3 & 0xff) * iVar11 >> 0x16);
    local_5c = (local_5c & 0xff) * iVar11 >> 0x16;
    uVar8 = (uVar8 & 0xff) * iVar11 >> 0x16;
  }
  iVar11 = (((uint)cVar4 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar4 >> 0x18) * 0x40;
  uVar12 = (uint)cVar4 >> 8;
  uVar9 = (uint)cVar4 >> 0x10;
  if (iVar11 != 0x4040) {
    iVar11 = iVar11 * 0xff;
    cVar4 = (color)(((uint)cVar4 & 0xff) * iVar11 >> 0x16);
    uVar12 = (uVar12 & 0xff) * iVar11 >> 0x16;
    uVar9 = (uVar9 & 0xff) * iVar11 >> 0x16;
  }
  iVar11 = (((uint)cVar5 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar5 >> 0x18) * 0x40;
  uVar10 = (uint)cVar5 >> 8;
  local_60 = (uint)cVar5 >> 0x10;
  if (iVar11 != 0x4040) {
    iVar11 = iVar11 * 0xff;
    cVar5 = (color)(((uint)cVar5 & 0xff) * iVar11 >> 0x16);
    uVar10 = (uVar10 & 0xff) * iVar11 >> 0x16;
    local_60 = (local_60 & 0xff) * iVar11 >> 0x16;
  }
  iVar11 = (((uint)cVar6 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar6 >> 0x18) * 0x40;
  local_88 = (uint)cVar6 >> 8;
  local_84 = (uint)cVar6 >> 0x10;
  if (iVar11 != 0x4040) {
    iVar11 = iVar11 * 0xff;
    cVar6 = (color)(((uint)cVar6 & 0xff) * iVar11 >> 0x16);
    local_88 = (local_88 & 0xff) * iVar11 >> 0x16;
    local_84 = (local_84 & 0xff) * iVar11 >> 0x16;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_a8,0x85);
  if (((cVar3.r != '\x10') || ((local_5c & 0xff) != 0x20)) || ((uVar8 & 0xff) != 0x30)) {
    pFVar7 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar7,&local_80,&local_58);
    __cxa_throw(pFVar7,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar1 = &local_58.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_a8,0x86);
  uVar8 = local_60;
  local_ac = cVar4.r;
  if (((local_ac != '\x10') || ((uVar12 & 0xff) != 0x20)) || ((uVar9 & 0xff) != 0x30)) {
    pFVar7 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar7,&local_80,&local_58);
    __cxa_throw(pFVar7,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  paVar2 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_a8,0x87);
  uVar9 = local_84;
  if (((cVar5.r == '\x10') && ((uVar10 & 0xff) == 0x20)) && ((uVar8 & 0xff) == 0x30)) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.filename._M_dataplus._M_p);
    }
    uVar8 = local_88;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_58,&local_a8,0x88);
    if (((cVar6.r == '\x10') && ((uVar8 & 0xff) == 0x20)) && ((uVar9 & 0xff) == 0x30)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.filename._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      return;
    }
    pFVar7 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar7,&local_80,&local_58);
    __cxa_throw(pFVar7,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar7 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar7,&local_80,&local_58);
  __cxa_throw(pFVar7,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( BlendingFullyOpaquePixelIsCopied )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel1;
				typedef mocks::pixel_rgbx<order_bgra> pixel2;
				typedef mocks::pixel_rgbx<order_argb> pixel3;
				typedef mocks::pixel_rgbx<order_abgr> pixel4;

				// INIT
				const uint8_t cover = 0xFF;
				blender_solid_color_rgb<pixel1, order_rgba> b1(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel2, order_bgra> b2(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel3, order_argb> b3(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel4, order_abgr> b4(color::make(0x10, 0x20, 0x30));
				pixel1 dest1 = { };
				pixel2 dest2 = { };
				pixel3 dest3 = { };
				pixel4 dest4 = { };

				// ACT
				b1(&dest1, 0, 0, 1, &cover);
				b2(&dest2, 0, 0, 1, &cover);
				b3(&dest3, 0, 0, 1, &cover);
				b4(&dest4, 0, 0, 1, &cover);

				// ASSERT
				pixel1 reference1 = { { 0x10, 0x20, 0x30 } };
				pixel2 reference2 = { { 0x30, 0x20, 0x10 } };
				pixel3 reference3 = { { 0, 0x10, 0x20, 0x30 } };
				pixel4 reference4 = { { 0, 0x30, 0x20, 0x10 } };

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
				assert_equal(reference3, dest3);
				assert_equal(reference4, dest4);
			}